

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ManBoxNumRec_rec(Cba_Ntk_t *p,int *pCountP,int *pCountU)

{
  int iVar1;
  int iVar2;
  Cba_ObjType_t CVar3;
  Cba_Ntk_t *p_00;
  int local_24;
  int Id;
  int iObj;
  int *pCountU_local;
  int *pCountP_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkId(p);
  if (pCountP[iVar1] < 0) {
    pCountU[iVar1] = 0;
    pCountP[iVar1] = 0;
    for (local_24 = 1; iVar2 = Vec_StrSize(&p->vObjType), local_24 < iVar2; local_24 = local_24 + 1)
    {
      CVar3 = Cba_ObjType(p,local_24);
      if (CVar3 != CBA_OBJ_NONE) {
        iVar2 = Cba_ObjIsBoxUser(p,local_24);
        if (iVar2 == 0) {
          pCountP[iVar1] = pCountP[iVar1] + 1;
        }
        else {
          p_00 = Cba_ObjNtk(p,local_24);
          Cba_ManBoxNumRec_rec(p_00,pCountP,pCountU);
          iVar2 = Cba_ObjNtkId(p,local_24);
          pCountP[iVar1] = pCountP[iVar2] + pCountP[iVar1];
          iVar2 = Cba_ObjNtkId(p,local_24);
          pCountU[iVar1] = pCountU[iVar2] + 1 + pCountU[iVar1];
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Cba_ManBoxNumRec_rec( Cba_Ntk_t * p, int * pCountP, int * pCountU )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountP[Id] >= 0 )
        return;
    pCountP[Id] = pCountU[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_ManBoxNumRec_rec( Cba_ObjNtk(p, iObj), pCountP, pCountU );
            pCountP[Id] += pCountP[Cba_ObjNtkId(p, iObj)];
            pCountU[Id] += pCountU[Cba_ObjNtkId(p, iObj)] + 1;
        }
        else
            pCountP[Id] += 1;
    }
}